

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsCloneObject(JsValueRef source,JsValueRef *newObject)

{
  bool bVar1;
  JsErrorCode JVar2;
  int iVar3;
  JsrtContext *currentContext;
  JavascriptProxy *this;
  DynamicObject *pDVar4;
  undefined4 extraout_var;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (source == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  currentContext = JsrtContext::GetCurrent();
  JVar2 = CheckContext(currentContext,false,false);
  if (JVar2 != JsNoError) {
    return JVar2;
  }
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  bVar1 = Js::VarIs<Js::JavascriptProxy>(source);
  while (bVar1 != false) {
    this = Js::UnsafeVarTo<Js::JavascriptProxy>(source);
    source = Js::JavascriptProxy::GetTarget(this);
    bVar1 = Js::VarIs<Js::JavascriptProxy>(source);
  }
  bVar1 = Js::DynamicObject::IsBaseDynamicObject(source);
  if ((!bVar1) && (bVar1 = Js::VarIs<JsrtExternalObject>(source), !bVar1)) {
    bVar1 = Js::VarIs<Js::CustomExternalWrapperObject>(source);
    JVar2 = JsErrorInvalidArgument;
    if (!bVar1) goto LAB_003c9f31;
  }
  pDVar4 = Js::UnsafeVarTo<Js::DynamicObject>(source);
  iVar3 = (*(pDVar4->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x69])(pDVar4,1);
  *newObject = (JsValueRef)CONCAT44(extraout_var,iVar3);
  JVar2 = JsNoError;
LAB_003c9f31:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar2;
}

Assistant:

CHAKRA_API JsCloneObject(_In_ JsValueRef source, _Out_ JsValueRef* newObject)
{
    VALIDATE_JSREF(source);

    return ContextAPINoScriptWrapper([&](Js::ScriptContext* scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        while (Js::VarIs<Js::JavascriptProxy>(source))
        {
            source = Js::UnsafeVarTo<Js::JavascriptProxy>(source)->GetTarget();
        }

        // We can currently only clone certain types of dynamic objects
        // TODO: support other object types
        if (Js::DynamicObject::IsBaseDynamicObject(source) ||
            Js::VarIs<JsrtExternalObject>(source) ||
            Js::VarIs<Js::CustomExternalWrapperObject>(source))
        {
            Js::DynamicObject* objSource = Js::UnsafeVarTo<Js::DynamicObject>(source);
            *newObject = objSource->Copy(true);
            return JsNoError;
        }

        return JsErrorInvalidArgument;
    });
}